

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

uint32 __thiscall Clasp::UncoreMinimize::analyze(UncoreMinimize *this,Solver *s)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  pointer pLVar4;
  pointer puVar5;
  pointer pLVar6;
  uint uVar7;
  ulong uVar8;
  uint32 uVar9;
  long lVar10;
  long lVar11;
  UncoreMinimize *this_00;
  size_type sVar12;
  bool bVar13;
  LitPair p;
  uint local_5c;
  LitPair local_58;
  UncoreMinimize *local_50;
  size_type local_48;
  uint32 local_44;
  long local_40;
  Todo *local_38;
  
  local_50 = this;
  if ((this->conflict_).ebo_.size == 0) {
    local_5c = (s->levels_).super_type.ebo_.size;
    uVar9 = 0;
  }
  else {
    pLVar4 = (this->conflict_).ebo_.buf;
    local_58.lit.rep_ = pLVar4->rep_;
    local_58.id = pLVar4[1].rep_;
    iVar2 = (this->litData_).ebo_.buf[local_58.id - 1].weight;
    bk_lib::
    pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>::
    push_back(&(this->todo_).lits_,&local_58);
    if (iVar2 < (local_50->todo_).minW_) {
      (local_50->todo_).minW_ = iVar2;
    }
    local_5c = *(uint *)((long)(s->assign_).assign_.ebo_.buf +
                        (ulong)(local_58.lit.rep_ & 0xfffffffc)) >> 4;
    uVar9 = 1;
  }
  (local_50->conflict_).ebo_.size = 0;
  if (local_50->eRoot_ < (s->levels_).super_type.ebo_.size) {
    local_44 = uVar9;
    Solver::resolveToCore(s,&local_50->conflict_);
    uVar8 = (ulong)(local_50->conflict_).ebo_.size;
    if (uVar8 != 0) {
      pLVar4 = (local_50->conflict_).ebo_.buf;
      puVar5 = (s->assign_).assign_.ebo_.buf;
      lVar11 = 0;
      do {
        uVar3 = *(uint *)((long)&pLVar4->rep_ + lVar11);
        puVar1 = (uint *)((long)puVar5 + (ulong)(uVar3 & 0xfffffffc));
        *puVar1 = *puVar1 | (uVar3 & 2) * 2 + 4;
        lVar11 = lVar11 + 4;
      } while (uVar8 << 2 != lVar11);
    }
    sVar12 = (local_50->conflict_).ebo_.size;
    uVar8 = (ulong)(local_50->assume_).ebo_.size;
    bVar13 = sVar12 != 0;
    this_00 = local_50;
    local_48 = sVar12;
    if (uVar8 != 0 && bVar13) {
      pLVar6 = (local_50->assume_).ebo_.buf;
      local_38 = &local_50->todo_;
      lVar11 = uVar8 * 8 + -8;
      lVar10 = 0;
      local_40 = lVar11;
      do {
        uVar3 = *(uint *)((long)&(pLVar6->lit).rep_ + lVar10);
        uVar7 = *(uint *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar3 & 0xfffffffc));
        if (((((uVar3 & 2) * 2 + 4 & uVar7) != 0) && (uVar7 = uVar7 >> 4, this_00->eRoot_ < uVar7))
           && (uVar7 <= this_00->aTop_)) {
          if (uVar7 < local_5c) {
            local_5c = uVar7;
          }
          local_58.lit.rep_ = uVar3 & 0xfffffffe ^ 2;
          local_58.id = *(uint32 *)((long)&pLVar6->id + lVar10);
          iVar2 = (this_00->litData_).ebo_.buf[*(int *)((long)&pLVar6->id + lVar10) - 1].weight;
          bk_lib::
          pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>
          ::push_back(&local_38->lits_,&local_58);
          if (iVar2 < (local_50->todo_).minW_) {
            (local_50->todo_).minW_ = iVar2;
          }
          puVar1 = (s->assign_).assign_.ebo_.buf + (uVar3 >> 2);
          *puVar1 = *puVar1 & 0xfffffff3;
          sVar12 = sVar12 - 1;
          lVar11 = local_40;
          this_00 = local_50;
        }
        bVar13 = sVar12 != 0;
      } while ((lVar11 != lVar10) && (lVar10 = lVar10 + 8, sVar12 != 0));
    }
    uVar9 = local_48 + local_44;
    popPath(this_00,s,(local_5c - 1) + (uint)(local_5c == 0));
    if (bVar13) {
      uVar9 = uVar9 - sVar12;
      uVar8 = (ulong)(this_00->conflict_).ebo_.size;
      if (uVar8 != 0) {
        pLVar4 = (this_00->conflict_).ebo_.buf;
        puVar5 = (s->assign_).assign_.ebo_.buf;
        lVar11 = 0;
        do {
          puVar1 = (uint *)((long)puVar5 +
                           (ulong)(*(uint *)((long)&pLVar4->rep_ + lVar11) & 0xfffffffc));
          *puVar1 = *puVar1 & 0xfffffff3;
          lVar11 = lVar11 + 4;
        } while (uVar8 << 2 != lVar11);
      }
    }
    (this_00->conflict_).ebo_.size = 0;
  }
  return uVar9;
}

Assistant:

uint32 UncoreMinimize::analyze(Solver& s) {
	uint32 cs    = 0;
	uint32 minDL = s.decisionLevel();
	if (!conflict_.empty()) {
		LitPair p(conflict_[0], conflict_[1].rep());
		assert(s.isTrue(p.lit));
		todo_.add(p, getData(p.id).weight);
		minDL = s.level(p.lit.var());
		cs = 1;
	}
	conflict_.clear();
	if (s.decisionLevel() <= eRoot_) {
		return cs;
	}
	s.resolveToCore(conflict_);
	for (LitVec::const_iterator it = conflict_.begin(), end = conflict_.end(); it != end; ++it) {
		s.markSeen(*it);
	}
	// map marked root decisions back to our assumptions
	uint32 roots = sizeVec(conflict_), dl;
	cs += roots;
	for (LitSet::iterator it = assume_.begin(), end = assume_.end(); it != end && roots; ++it) {
		Literal p = it->lit;
		if (s.seen(p) && (dl = s.level(p.var())) > eRoot_ && dl <= aTop_) {
			assert(p == s.decision(dl) && getData(it->id).assume);
			if (dl < minDL) { minDL = dl; }
			todo_.add(LitPair(~p, it->id), getData(it->id).weight);
			assert(s.isFalse(~p));
			s.clearSeen(p.var());
			--roots;
		}
	}
	popPath(s, minDL - (minDL != 0));
	if (roots) { // clear remaining levels - can only happen if someone messed with our assumptions
		cs -= roots;
		for (LitVec::const_iterator it = conflict_.begin(), end = conflict_.end(); it != end; ++it) { s.clearSeen(it->var()); }
	}
	conflict_.clear();
	return cs;
}